

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void btSoftBody::PSolve_RContacts(btSoftBody *psb,btScalar kst,btScalar ti)

{
  bool bVar1;
  btCollisionShape *pbVar2;
  float *pfVar3;
  btCollisionObject *in_RDI;
  btScalar bVar4;
  btVector3 bVar5;
  btVector3 bVar6;
  btVector3 impulse;
  btVector3 fv;
  btScalar dp;
  btScalar dn;
  btVector3 vr;
  btVector3 vb;
  btVector3 va;
  btRigidBody *tmpRigid;
  sCti *cti;
  RContact *c;
  int ni;
  int i;
  btScalar mrg;
  btScalar dt;
  btCollisionObject *in_stack_fffffffffffffec8;
  btMatrix3x3 *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  btScalar in_stack_fffffffffffffedc;
  btRigidBody *in_stack_fffffffffffffee0;
  btRigidBody *this;
  float local_90;
  float local_8c;
  btScalar local_88;
  btScalar local_84 [4];
  btScalar local_74 [4];
  btScalar local_64;
  btScalar local_60;
  btScalar local_5c;
  btScalar local_58 [4];
  btVector3 local_48;
  btRigidBody *local_38;
  RContact *local_30;
  RContact *local_28;
  btScalar local_20;
  btScalar local_1c;
  float local_18;
  btScalar local_14;
  btCollisionObject *local_8;
  
  local_14 = in_RDI[1].m_deactivationTime;
  local_8 = in_RDI;
  pbVar2 = btCollisionObject::getCollisionShape(in_RDI);
  (*pbVar2->_vptr_btCollisionShape[0xc])();
  local_1c = 0.0;
  local_20 = (btScalar)
             btAlignedObjectArray<btSoftBody::RContact>::size
                       ((btAlignedObjectArray<btSoftBody::RContact> *)
                        (local_8[3].m_worldTransform.m_basis.m_el[1].m_floats + 2));
  for (; (int)local_1c < (int)local_20; local_1c = (btScalar)((int)local_1c + 1)) {
    local_30 = btAlignedObjectArray<btSoftBody::RContact>::operator[]
                         ((btAlignedObjectArray<btSoftBody::RContact> *)
                          (local_8[3].m_worldTransform.m_basis.m_el[1].m_floats + 2),(int)local_1c);
    local_28 = local_30;
    bVar1 = btCollisionObject::hasContactResponse((local_30->m_cti).m_colObj);
    if (bVar1) {
      local_38 = btRigidBody::upcast(in_stack_fffffffffffffec8);
      if (local_38 == (btRigidBody *)0x0) {
        local_5c = 0.0;
        local_60 = 0.0;
        local_64 = 0.0;
        btVector3::btVector3(&local_48,&local_5c,&local_60,&local_64);
      }
      else {
        local_58 = (btScalar  [4])
                   btRigidBody::getVelocityInLocalPoint
                             (in_stack_fffffffffffffee0,
                              (btVector3 *)
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        local_48 = ::operator*((btVector3 *)in_stack_fffffffffffffee0,
                               (btScalar *)
                               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      }
      local_74 = (btScalar  [4])
                 operator-((btVector3 *)in_stack_fffffffffffffee0,
                           (btVector3 *)
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      local_84 = (btScalar  [4])
                 operator-((btVector3 *)in_stack_fffffffffffffee0,
                           (btVector3 *)
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      local_88 = btDot(in_stack_fffffffffffffed0->m_el,(btVector3 *)in_stack_fffffffffffffec8);
      if (local_88 <= 1.1920929e-07) {
        bVar4 = btDot(in_stack_fffffffffffffed0->m_el,(btVector3 *)in_stack_fffffffffffffec8);
        local_90 = bVar4 + (local_30->m_cti).m_offset;
        pfVar3 = btMin<float>(&local_90,&local_18);
        local_8c = *pfVar3;
        ::operator*((btVector3 *)in_stack_fffffffffffffee0,
                    (btScalar *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        in_stack_fffffffffffffec8 = (btCollisionObject *)local_84;
        operator-((btVector3 *)in_stack_fffffffffffffee0,
                  (btVector3 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        in_stack_fffffffffffffed0 = &local_28->m_c0;
        bVar5 = ::operator*((btVector3 *)in_stack_fffffffffffffee0,
                            (btScalar *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        this = bVar5.m_floats._0_8_;
        operator-((btVector3 *)in_stack_fffffffffffffee0,
                  (btVector3 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        bVar5 = ::operator*((btVector3 *)in_stack_fffffffffffffee0,
                            (btScalar *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        operator+((btVector3 *)in_stack_fffffffffffffee0,
                  (btVector3 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        ::operator*((btVector3 *)in_stack_fffffffffffffee0,
                    (btScalar *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        ::operator*((btMatrix3x3 *)in_stack_fffffffffffffee0,
                    (btVector3 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        bVar6 = ::operator*((btVector3 *)in_stack_fffffffffffffee0,
                            (btScalar *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        in_stack_fffffffffffffedc = bVar6.m_floats[0];
        in_stack_fffffffffffffee0 = bVar6.m_floats._4_8_;
        btVector3::operator-=(&local_28->m_node->m_x,(btVector3 *)&stack0xfffffffffffffedc);
        if (local_38 != (btRigidBody *)0x0) {
          btRigidBody::applyImpulse(this,bVar5.m_floats._8_8_,bVar5.m_floats._0_8_);
        }
      }
    }
  }
  return;
}

Assistant:

void btSoftBody::PSolve_RContacts(btSoftBody* psb, btScalar kst, btScalar ti)
{
	const btScalar	dt = psb->m_sst.sdt;
	const btScalar	mrg = psb->getCollisionShape()->getMargin();
	for(int i=0,ni=psb->m_rcontacts.size();i<ni;++i)
	{
		const RContact&		c = psb->m_rcontacts[i];
		const sCti&			cti = c.m_cti;	
		if (cti.m_colObj->hasContactResponse()) 
		{
			btRigidBody* tmpRigid = (btRigidBody*)btRigidBody::upcast(cti.m_colObj);
			const btVector3		va = tmpRigid ? tmpRigid->getVelocityInLocalPoint(c.m_c1)*dt : btVector3(0,0,0);
			const btVector3		vb = c.m_node->m_x-c.m_node->m_q;	
			const btVector3		vr = vb-va;
			const btScalar		dn = btDot(vr, cti.m_normal);		
			if(dn<=SIMD_EPSILON)
			{
				const btScalar		dp = btMin( (btDot(c.m_node->m_x, cti.m_normal) + cti.m_offset), mrg );
				const btVector3		fv = vr - (cti.m_normal * dn);
				// c0 is the impulse matrix, c3 is 1 - the friction coefficient or 0, c4 is the contact hardness coefficient
				const btVector3		impulse = c.m_c0 * ( (vr - (fv * c.m_c3) + (cti.m_normal * (dp * c.m_c4))) * kst );
				c.m_node->m_x -= impulse * c.m_c2;
				if (tmpRigid)
					tmpRigid->applyImpulse(impulse,c.m_c1);
			}
		}
	}
}